

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

int64_t __thiscall
icu_63::RegexMatcher::appendGroup
          (RegexMatcher *this,int32_t groupNum,UText *dest,UErrorCode *status)

{
  int iVar1;
  UBool UVar2;
  int32_t iVar3;
  UChar *dest_00;
  UChar *groupChars;
  UErrorCode lengthStatus;
  int32_t len16;
  int64_t deltaLen;
  int64_t iStack_48;
  int32_t groupOffset;
  int64_t e;
  int64_t s;
  int64_t destLen;
  UErrorCode *status_local;
  UText *dest_local;
  RegexMatcher *pRStack_18;
  int32_t groupNum_local;
  RegexMatcher *this_local;
  
  destLen = (int64_t)status;
  status_local = (UErrorCode *)dest;
  dest_local._4_4_ = groupNum;
  pRStack_18 = this;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    UVar2 = ::U_FAILURE(this->fDeferredStatus);
    if (UVar2 == '\0') {
      s = utext_nativeLength_63((UText *)status_local);
      iVar1 = dest_local._4_4_;
      if (this->fMatch == '\0') {
        *(undefined4 *)destLen = 0x10302;
        iVar3 = utext_replace_63((UText *)status_local,s,s,(UChar *)0x0,0,(UErrorCode *)destLen);
        this_local = (RegexMatcher *)(long)iVar3;
      }
      else {
        if ((-1 < dest_local._4_4_) &&
           (iVar3 = UVector32::size(this->fPattern->fGroupMap), iVar1 <= iVar3)) {
          if (dest_local._4_4_ == 0) {
            e = this->fMatchStart;
            iStack_48 = this->fMatchEnd;
          }
          else {
            deltaLen._4_4_ = UVector32::elementAti(this->fPattern->fGroupMap,dest_local._4_4_ + -1);
            e = this->fFrame->fExtra[deltaLen._4_4_];
            iStack_48 = this->fFrame->fExtra[deltaLen._4_4_ + 1];
          }
          if (e < 0) {
            iVar3 = utext_replace_63((UText *)status_local,s,s,(UChar *)0x0,0,(UErrorCode *)destLen)
            ;
            return (long)iVar3;
          }
          if (((this->fInputText->chunkNativeStart == 0) &&
              (this->fInputLength == this->fInputText->chunkNativeLimit)) &&
             (this->fInputLength == (long)this->fInputText->nativeIndexingLimit)) {
            iVar3 = utext_replace_63((UText *)status_local,s,s,this->fInputText->chunkContents + e,
                                     (int)iStack_48 - (int)e,(UErrorCode *)destLen);
            _lengthStatus = (long)iVar3;
          }
          else {
            if (this->fInputText->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0
               ) {
              groupChars._4_4_ = (int)iStack_48 - (int)e;
            }
            else {
              groupChars._0_4_ = 0;
              groupChars._4_4_ =
                   utext_extract_63(this->fInputText,e,iStack_48,(UChar *)0x0,0,
                                    (UErrorCode *)&groupChars);
            }
            dest_00 = (UChar *)uprv_malloc_63((long)(groupChars._4_4_ + 1) << 1);
            if (dest_00 == (UChar *)0x0) {
              *(undefined4 *)destLen = 7;
              return 0;
            }
            utext_extract_63(this->fInputText,e,iStack_48,dest_00,groupChars._4_4_ + 1,
                             (UErrorCode *)destLen);
            iVar3 = utext_replace_63((UText *)status_local,s,s,dest_00,groupChars._4_4_,
                                     (UErrorCode *)destLen);
            _lengthStatus = (long)iVar3;
            uprv_free_63(dest_00);
          }
          return _lengthStatus;
        }
        *(undefined4 *)destLen = 8;
        iVar3 = utext_replace_63((UText *)status_local,s,s,(UChar *)0x0,0,(UErrorCode *)destLen);
        this_local = (RegexMatcher *)(long)iVar3;
      }
    }
    else {
      *(UErrorCode *)destLen = this->fDeferredStatus;
      this_local = (RegexMatcher *)0x0;
    }
  }
  else {
    this_local = (RegexMatcher *)0x0;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t RegexMatcher::appendGroup(int32_t groupNum, UText *dest, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return 0;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return 0;
    }
    int64_t destLen = utext_nativeLength(dest);

    if (fMatch == FALSE) {
        status = U_REGEX_INVALID_STATE;
        return utext_replace(dest, destLen, destLen, NULL, 0, &status);
    }
    if (groupNum < 0 || groupNum > fPattern->fGroupMap->size()) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return utext_replace(dest, destLen, destLen, NULL, 0, &status);
    }

    int64_t s, e;
    if (groupNum == 0) {
        s = fMatchStart;
        e = fMatchEnd;
    } else {
        int32_t groupOffset = fPattern->fGroupMap->elementAti(groupNum-1);
        U_ASSERT(groupOffset < fPattern->fFrameSize);
        U_ASSERT(groupOffset >= 0);
        s = fFrame->fExtra[groupOffset];
        e = fFrame->fExtra[groupOffset+1];
    }

    if (s < 0) {
        // A capture group wasn't part of the match
        return utext_replace(dest, destLen, destLen, NULL, 0, &status);
    }
    U_ASSERT(s <= e);

    int64_t deltaLen;
    if (UTEXT_FULL_TEXT_IN_CHUNK(fInputText, fInputLength)) {
        U_ASSERT(e <= fInputLength);
        deltaLen = utext_replace(dest, destLen, destLen, fInputText->chunkContents+s, (int32_t)(e-s), &status);
    } else {
        int32_t len16;
        if (UTEXT_USES_U16(fInputText)) {
            len16 = (int32_t)(e-s);
        } else {
            UErrorCode lengthStatus = U_ZERO_ERROR;
            len16 = utext_extract(fInputText, s, e, NULL, 0, &lengthStatus);
        }
        UChar *groupChars = (UChar *)uprv_malloc(sizeof(UChar)*(len16+1));
        if (groupChars == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return 0;
        }
        utext_extract(fInputText, s, e, groupChars, len16+1, &status);

        deltaLen = utext_replace(dest, destLen, destLen, groupChars, len16, &status);
        uprv_free(groupChars);
    }
    return deltaLen;
}